

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_connection_tests.cpp
# Opt level: O2

void __thiscall
net_peer_connection_tests::PeerTest::AddPeer
          (PeerTest *this,NodeId *id,vector<CNode_*,_std::allocator<CNode_*>_> *nodes,
          PeerManager *peerman,ConnmanTestMsg *connman,ConnectionType conn_type,bool onion_peer,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          address)

{
  uint16_t portDefault;
  long lVar1;
  long lVar2;
  DNSLookupFn dns_lookup_function;
  CService ipIn;
  CService ipIn_00;
  readonly_property65 rVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  CChainParams *pCVar5;
  uint64_t uVar6;
  CNode *pCVar7;
  ConnmanTestMsg *pCVar8;
  undefined4 in_register_0000008c;
  iterator pvVar9;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> addr_00;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  shared_ptr<Sock> sock;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  check_type cVar10;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined1 in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdc9;
  CNodeOptions *in_stack_fffffffffffffdd0;
  undefined1 local_1f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  assertion_result local_198;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tor_addr;
  CService local_120;
  undefined1 local_f8 [16];
  shared_count sStack_e8;
  char **local_e0;
  undefined1 local_d8;
  CService local_d0;
  undefined1 local_a8 [56];
  CAddress addr;
  
  pvVar9 = (iterator)CONCAT44(in_register_0000008c,conn_type);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar8 = connman;
  CAddress::CAddress(&addr);
  if (*(char *)((long)address.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p + 0x20) == '\x01') {
    name = std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)address.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p);
    pCVar5 = Params();
    portDefault = pCVar5->nDefaultPort;
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_160,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffdac;
    dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffda8;
    dns_lookup_function.super__Function_base._M_functor._8_8_ = (undefined8)_cVar10;
    dns_lookup_function.super__Function_base._M_manager._0_4_ = in_stack_fffffffffffffdb8;
    dns_lookup_function.super__Function_base._M_manager._4_4_ = in_stack_fffffffffffffdbc;
    dns_lookup_function._M_invoker._0_4_ = in_stack_fffffffffffffdc0;
    dns_lookup_function._M_invoker._4_4_ = in_stack_fffffffffffffdc4;
    LookupNumeric((CService *)local_f8,name,portDefault,dns_lookup_function);
    MaybeFlipIPv6toCJDNS(&local_d0,(CService *)local_f8);
    ipIn.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffffdac;
    ipIn.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffffda8;
    ipIn.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar10;
    ipIn.super_CNetAddr.m_addr._size = in_stack_fffffffffffffdb8;
    ipIn.super_CNetAddr.m_addr._20_4_ = in_stack_fffffffffffffdbc;
    ipIn.super_CNetAddr.m_net = in_stack_fffffffffffffdc0;
    ipIn.super_CNetAddr.m_scope_id = in_stack_fffffffffffffdc4;
    ipIn.port._0_1_ = in_stack_fffffffffffffdc8;
    ipIn._33_7_ = in_stack_fffffffffffffdc9;
    CAddress::CAddress((CAddress *)local_a8,ipIn,(ServiceFlags)&local_d0);
    CAddress::operator=(&addr,(CAddress *)local_a8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_a8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_f8);
    std::_Function_base::~_Function_base(&local_160.super__Function_base);
  }
  else if (onion_peer) {
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&tor_addr,
               &(this->super_LogIPsTestingSetup).super_TestingSetup.super_ChainTestingSetup.
                super_BasicTestingSetup.m_rng.super_RandomMixin<FastRandomContext>,0x20);
    local_170 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x38;
    file.m_begin = (iterator)&local_170;
    msg.m_end = pvVar9;
    msg.m_begin = (iterator)pCVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_180,msg);
    addr_00.m_size =
         (long)tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    addr_00.m_data =
         tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    OnionToString_abi_cxx11_((string *)local_a8,addr_00);
    rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CNetAddr::SetSpecial((CNetAddr *)&addr,(string *)local_a8);
    local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
    local_198.m_message.px = (element_type *)0x0;
    local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_e0 = &local_1a8;
    local_1a8 = "addr.SetSpecial(OnionToString(tor_addr))";
    local_1a0 = "";
    local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
    local_f8._0_8_ = &PTR__lazy_ostream_011481f0;
    sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_1b0 = "";
    in_stack_fffffffffffffda8 = 0;
    in_stack_fffffffffffffdac = 0;
    pCVar8 = (ConnmanTestMsg *)0x2;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_198,(lazy_ostream *)local_f8,2,0,WARN,_cVar10,(size_t)&local_1b8,0x38);
    boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
    std::__cxx11::string::~string((string *)local_a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  while( true ) {
    bVar4 = CNetAddr::IsLocal((CNetAddr *)&addr);
    if (bVar4) break;
    bVar4 = CNetAddr::IsRoutable((CNetAddr *)&addr);
    if (bVar4) break;
    uVar6 = RandomMixin<FastRandomContext>::randbits
                      (&(this->super_LogIPsTestingSetup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_rng.super_RandomMixin<FastRandomContext>,0x20);
    tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(tor_addr.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,(int)uVar6);
    CNetAddr::CNetAddr((CNetAddr *)local_f8,(in_addr *)&tor_addr);
    pCVar5 = Params();
    CService::CService(&local_120,(CNetAddr *)local_f8,pCVar5->nDefaultPort);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_f8);
    ipIn_00.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffffdac;
    ipIn_00.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffffda8;
    ipIn_00.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar10;
    ipIn_00.super_CNetAddr.m_addr._size = in_stack_fffffffffffffdb8;
    ipIn_00.super_CNetAddr.m_addr._20_4_ = in_stack_fffffffffffffdbc;
    ipIn_00.super_CNetAddr.m_net = in_stack_fffffffffffffdc0;
    ipIn_00.super_CNetAddr.m_scope_id = in_stack_fffffffffffffdc4;
    ipIn_00.port._0_1_ = in_stack_fffffffffffffdc8;
    ipIn_00._33_7_ = in_stack_fffffffffffffdc9;
    CAddress::CAddress((CAddress *)local_a8,ipIn_00,(ServiceFlags)&local_120);
    CAddress::operator=(&addr,(CAddress *)local_a8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_a8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120);
  }
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3f;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = (iterator)pCVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  bVar4 = CNetAddr::IsValid((CNetAddr *)&addr);
  local_f8[0] = bVar4;
  local_f8._8_8_ = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "addr.IsValid()";
  tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a8._24_8_ = &tor_addr;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_1e0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f8,(lazy_ostream *)local_a8,2,0,WARN,_cVar10,
             (size_t)&local_1e8,0x3f);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  pCVar7 = (CNode *)operator_new(0x3a8);
  lVar2 = *id;
  *id = lVar2 + 1;
  local_1f8 = (undefined1  [8])0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CAddress::CAddress((CAddress *)local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"",(allocator<char> *)&local_1a8);
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
  local_f8._8_8_ = 0;
  sStack_e8.pi_ = sStack_e8.pi_ & 0xffffffffffffff00;
  local_e0 = (char **)0x4c4b40;
  local_d8 = 0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&addr;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_1f8;
  CNode::CNode(pCVar7,lVar2 + 1,sock,(CAddress *)0x0,0,(uint64_t)local_a8,(CAddress *)&tor_addr,
               (string *)CONCAT44(in_stack_fffffffffffffdbc,conn_type),
               (uint)(conn_type == INBOUND && onion_peer),SUB81(local_f8,0),
               in_stack_fffffffffffffdd0);
  local_198._0_8_ = pCVar7;
  std::vector<CNode*,std::allocator<CNode*>>::emplace_back<CNode*>
            ((vector<CNode*,std::allocator<CNode*>> *)nodes,(CNode **)&local_198);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             (local_f8 + 8));
  std::__cxx11::string::~string((string *)&tor_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1f0);
  pCVar7 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
           super__Vector_impl_data._M_finish[-1];
  LOCK();
  (pCVar7->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (**(peerman->super_NetEventsInterface)._vptr_NetEventsInterface)
            (&peerman->super_NetEventsInterface,pCVar7,9);
  LOCK();
  (pCVar7->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode(connman,pCVar7);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddPeer(NodeId& id, std::vector<CNode*>& nodes, PeerManager& peerman, ConnmanTestMsg& connman, ConnectionType conn_type, bool onion_peer = false, std::optional<std::string> address = std::nullopt)
{
    CAddress addr{};

    if (address.has_value()) {
        addr = CAddress{MaybeFlipIPv6toCJDNS(LookupNumeric(address.value(), Params().GetDefaultPort())), NODE_NONE};
    } else if (onion_peer) {
        auto tor_addr{m_rng.randbytes(ADDR_TORV3_SIZE)};
        BOOST_REQUIRE(addr.SetSpecial(OnionToString(tor_addr)));
    }

    while (!addr.IsLocal() && !addr.IsRoutable()) {
        addr = CAddress{ip(m_rng.randbits(32)), NODE_NONE};
    }

    BOOST_REQUIRE(addr.IsValid());

    const bool inbound_onion{onion_peer && conn_type == ConnectionType::INBOUND};

    nodes.emplace_back(new CNode{++id,
                                 /*sock=*/nullptr,
                                 addr,
                                 /*nKeyedNetGroupIn=*/0,
                                 /*nLocalHostNonceIn=*/0,
                                 CAddress{},
                                 /*addrNameIn=*/"",
                                 conn_type,
                                 /*inbound_onion=*/inbound_onion});
    CNode& node = *nodes.back();
    node.SetCommonVersion(PROTOCOL_VERSION);

    peerman.InitializeNode(node, ServiceFlags(NODE_NETWORK | NODE_WITNESS));
    node.fSuccessfullyConnected = true;

    connman.AddTestNode(node);
}